

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscroller.cpp
# Opt level: O1

qreal __thiscall
QScrollerPrivate::nextSnapPos(QScrollerPrivate *this,qreal p,int dir,Orientation orientation)

{
  double dVar1;
  long lVar2;
  double *pdVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  char cVar7;
  long lVar8;
  bool bVar9;
  ulong uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  double dVar16;
  double local_80;
  undefined1 local_48 [16];
  
  local_80 = (double)qQNaN();
  local_48._0_8_ = qInf();
  local_48._8_4_ = extraout_XMM0_Dc;
  local_48._12_4_ = extraout_XMM0_Dd;
  bVar9 = orientation != Horizontal;
  dVar16 = (&(this->contentPosRange).xp)[bVar9];
  dVar6 = (&(this->contentPosRange).w)[bVar9] + dVar16;
  if (bVar9) {
    lVar2 = (this->snapPositionsY).d.size;
    if (lVar2 != 0) {
      pdVar3 = (this->snapPositionsY).d.ptr;
      lVar8 = 0;
      do {
        dVar1 = *(double *)((long)pdVar3 + lVar8);
        dVar13 = dVar1 - p;
        if (((((dir < 1 || 0.0 <= dVar13) && (-1 < dir || dVar13 <= 0.0)) && (dVar16 <= dVar1)) &&
            (dVar1 <= dVar6)) &&
           ((cVar7 = qIsNaN(local_80), cVar7 != '\0' ||
            (uVar10 = -(ulong)(dVar13 < -dVar13),
            (double)(~uVar10 & (ulong)dVar13 | (ulong)-dVar13 & uVar10) < (double)local_48._0_8_))))
        {
          uVar10 = -(ulong)(dVar13 < -dVar13);
          auVar15._0_8_ = ~uVar10 & (ulong)dVar13;
          auVar15._8_8_ = 0;
          auVar5._8_4_ = 0;
          auVar5._0_8_ = (ulong)-dVar13 & uVar10;
          auVar5._12_4_ = 0x80000000;
          local_48 = auVar15 | auVar5;
          local_80 = dVar1;
        }
        lVar8 = lVar8 + 8;
      } while (lVar2 << 3 != lVar8);
    }
    dVar1 = this->snapIntervalY;
    if (dVar1 <= 0.0) {
      return local_80;
    }
    dVar16 = dVar16 + this->snapFirstY;
    if (dir < 1) {
      if (dir < 0) {
        dVar13 = floor((p - dVar16) / dVar1);
        uVar11 = SUB84(dVar13,0);
        uVar12 = (undefined4)((ulong)dVar13 >> 0x20);
        goto LAB_006615c8;
      }
      dVar13 = dVar16;
      if (dVar16 < p) {
        dVar13 = floor((dVar6 - dVar16) / dVar1);
        dVar13 = (double)(int)dVar13 * dVar1 + dVar16;
        if (dVar13 <= p) goto LAB_006615e0;
        dVar13 = (p - dVar16) / dVar1;
        dVar13 = (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000) + dVar13;
        goto LAB_006615dc;
      }
    }
    else {
      dVar13 = ceil((p - dVar16) / dVar1);
      uVar11 = SUB84(dVar13,0);
      uVar12 = (undefined4)((ulong)dVar13 >> 0x20);
LAB_006615c8:
      dVar13 = (double)CONCAT44(uVar12,uVar11);
LAB_006615dc:
      dVar13 = (double)(int)dVar13 * dVar1 + dVar16;
    }
LAB_006615e0:
    if (dVar13 < dVar16) {
      return local_80;
    }
    if (dVar6 < dVar13) {
      return local_80;
    }
    cVar7 = qIsNaN(local_80);
    if (cVar7 != '\0') {
      return dVar13;
    }
    goto LAB_00661750;
  }
  lVar2 = (this->snapPositionsX).d.size;
  if (lVar2 != 0) {
    pdVar3 = (this->snapPositionsX).d.ptr;
    lVar8 = 0;
    do {
      dVar1 = *(double *)((long)pdVar3 + lVar8);
      dVar13 = dVar1 - p;
      if ((((dir < 1 || 0.0 <= dVar13) && (-1 < dir || dVar13 <= 0.0)) &&
          ((dVar16 <= dVar1 && (dVar1 <= dVar6)))) &&
         ((cVar7 = qIsNaN(local_80), cVar7 != '\0' ||
          (uVar10 = -(ulong)(dVar13 < -dVar13),
          (double)(~uVar10 & (ulong)dVar13 | (ulong)-dVar13 & uVar10) < (double)local_48._0_8_)))) {
        uVar10 = -(ulong)(dVar13 < -dVar13);
        auVar14._0_8_ = ~uVar10 & (ulong)dVar13;
        auVar14._8_8_ = 0;
        auVar4._8_4_ = 0;
        auVar4._0_8_ = (ulong)-dVar13 & uVar10;
        auVar4._12_4_ = 0x80000000;
        local_48 = auVar14 | auVar4;
        local_80 = dVar1;
      }
      lVar8 = lVar8 + 8;
    } while (lVar2 << 3 != lVar8);
  }
  dVar1 = this->snapIntervalX;
  if (dVar1 <= 0.0) {
    return local_80;
  }
  dVar16 = dVar16 + this->snapFirstX;
  if (dir < 1) {
    if (dir < 0) {
      dVar13 = floor((p - dVar16) / dVar1);
      uVar11 = SUB84(dVar13,0);
      uVar12 = (undefined4)((ulong)dVar13 >> 0x20);
      goto LAB_00661521;
    }
    dVar13 = dVar16;
    if (dVar16 < p) {
      dVar13 = floor((dVar6 - dVar16) / dVar1);
      dVar13 = (double)(int)dVar13 * dVar1 + dVar16;
      if (dVar13 <= p) goto LAB_00661539;
      dVar13 = (p - dVar16) / dVar1;
      dVar13 = (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000) + dVar13;
      goto LAB_00661535;
    }
  }
  else {
    dVar13 = ceil((p - dVar16) / dVar1);
    uVar11 = SUB84(dVar13,0);
    uVar12 = (undefined4)((ulong)dVar13 >> 0x20);
LAB_00661521:
    dVar13 = (double)CONCAT44(uVar12,uVar11);
LAB_00661535:
    dVar13 = (double)(int)dVar13 * dVar1 + dVar16;
  }
LAB_00661539:
  if (dVar13 < dVar16) {
    return local_80;
  }
  if (dVar6 < dVar13) {
    return local_80;
  }
  cVar7 = qIsNaN(local_80);
  if (cVar7 != '\0') {
    return dVar13;
  }
LAB_00661750:
  dVar16 = dVar13 - p;
  uVar10 = -(ulong)(dVar16 < -dVar16);
  if ((double)(~uVar10 & (ulong)dVar16 | (ulong)-dVar16 & uVar10) < (double)local_48._0_8_) {
    return dVar13;
  }
  return local_80;
}

Assistant:

qreal QScrollerPrivate::nextSnapPos(qreal p, int dir, Qt::Orientation orientation) const
{
    qreal bestSnapPos = Q_QNAN;
    qreal bestSnapPosDist = Q_INFINITY;

    qreal minPos;
    qreal maxPos;

    if (orientation == Qt::Horizontal) {
        minPos = contentPosRange.left();
        maxPos = contentPosRange.right();
    } else {
        minPos = contentPosRange.top();
        maxPos = contentPosRange.bottom();
    }

    if (orientation == Qt::Horizontal) {
        // the snap points in the list
        for (qreal snapPos : snapPositionsX) {
            qreal snapPosDist = snapPos - p;
            if ((dir > 0 && snapPosDist < 0) ||
                (dir < 0 && snapPosDist > 0))
                continue; // wrong direction
            if (snapPos < minPos || snapPos > maxPos )
                continue; // invalid

            if (qIsNaN(bestSnapPos) ||
                qAbs(snapPosDist) < bestSnapPosDist ) {
                bestSnapPos = snapPos;
                bestSnapPosDist = qAbs(snapPosDist);
            }
        }

        // the snap point interval
        if (snapIntervalX > 0.0) {
            qreal first = minPos + snapFirstX;
            qreal snapPos;
            if (dir > 0)
                snapPos = qCeil((p - first) / snapIntervalX) * snapIntervalX + first;
            else if (dir < 0)
                snapPos = qFloor((p - first) / snapIntervalX) * snapIntervalX + first;
            else if (p <= first)
                snapPos = first;
            else
            {
                qreal last = qFloor((maxPos - first) / snapIntervalX) * snapIntervalX + first;
                if (p >= last)
                    snapPos = last;
                else
                    snapPos = qRound((p - first) / snapIntervalX) * snapIntervalX + first;
            }

            if (snapPos >= first && snapPos <= maxPos ) {
                qreal snapPosDist = snapPos - p;

                if (qIsNaN(bestSnapPos) ||
                    qAbs(snapPosDist) < bestSnapPosDist ) {
                    bestSnapPos = snapPos;
                    bestSnapPosDist = qAbs(snapPosDist);
                }
            }
        }

    } else { // (orientation == Qt::Vertical)
        // the snap points in the list
        for (qreal snapPos : snapPositionsY) {
            qreal snapPosDist = snapPos - p;
            if ((dir > 0 && snapPosDist < 0) ||
                (dir < 0 && snapPosDist > 0))
                continue; // wrong direction
            if (snapPos < minPos || snapPos > maxPos )
                continue; // invalid

            if (qIsNaN(bestSnapPos) ||
                qAbs(snapPosDist) < bestSnapPosDist) {
                bestSnapPos = snapPos;
                bestSnapPosDist = qAbs(snapPosDist);
            }
        }

        // the snap point interval
        if (snapIntervalY > 0.0) {
            qreal first = minPos + snapFirstY;
            qreal snapPos;
            if (dir > 0)
                snapPos = qCeil((p - first) / snapIntervalY) * snapIntervalY + first;
            else if (dir < 0)
                snapPos = qFloor((p - first) / snapIntervalY) * snapIntervalY + first;
            else if (p <= first)
                snapPos = first;
            else
            {
                qreal last = qFloor((maxPos - first) / snapIntervalY) * snapIntervalY + first;
                if (p >= last)
                    snapPos = last;
                else
                    snapPos = qRound((p - first) / snapIntervalY) * snapIntervalY + first;
            }

            if (snapPos >= first && snapPos <= maxPos ) {
                qreal snapPosDist = snapPos - p;

                if (qIsNaN(bestSnapPos) ||
                    qAbs(snapPosDist) < bestSnapPosDist) {
                    bestSnapPos = snapPos;
                    bestSnapPosDist = qAbs(snapPosDist);
                }
            }
        }
    }

    return bestSnapPos;
}